

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_advection_diffusion_reaction_splitting.c
# Opt level: O3

int f_diffusion(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  
  pdVar2 = (double *)N_VGetArrayPointer();
  if (pdVar2 == (double *)0x0) {
    f_diffusion_cold_2();
  }
  else {
    pdVar3 = (double *)N_VGetArrayPointer(ydot);
    if (pdVar3 != (double *)0x0) {
      dVar5 = *(double *)((long)user_data + 0x18) /
              (*(double *)((long)user_data + 8) * *(double *)((long)user_data + 8));
      *pdVar3 = ((*(double *)((long)user_data + 0x28) - (*pdVar2 + *pdVar2)) + pdVar2[1]) * dVar5;
      lVar1 = *user_data;
      if (2 < lVar1) {
        lVar4 = 0;
        do {
          pdVar3[lVar4 + 1] =
               ((pdVar2[lVar4 + 2] - (pdVar2[lVar4 + 1] + pdVar2[lVar4 + 1])) + pdVar2[lVar4]) *
               dVar5;
          lVar4 = lVar4 + 1;
        } while (lVar1 + -2 != lVar4);
      }
      pdVar3[lVar1 + -1] =
           dVar5 * ((pdVar2[lVar1 + -2] - (pdVar2[lVar1 + -1] + pdVar2[lVar1 + -1])) +
                   *(double *)((long)user_data + 0x28));
      return 0;
    }
    f_diffusion_cold_1();
  }
  return 1;
}

Assistant:

static int f_diffusion(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData* udata = (UserData*)user_data;
  sunrealtype* Y  = NULL;
  Y               = N_VGetArrayPointer(y); /* access data arrays */
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  sunrealtype* Ydot = NULL;
  Ydot              = N_VGetArrayPointer(ydot);
  if (check_flag((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  sunrealtype coeff = udata->b / (udata->dx * udata->dx);

  /* Left boundary */
  Ydot[0] = coeff * (udata->u0 - 2 * Y[0] + Y[1]);
  /* Interior */
  for (sunindextype i = 1; i < udata->N - 1; i++)
  {
    Ydot[i] = coeff * (Y[i + 1] - 2 * Y[i] + Y[i - 1]);
  }
  /* Right boundary */
  Ydot[udata->N - 1] = coeff *
                       (Y[udata->N - 2] - 2 * Y[udata->N - 1] + udata->u0);

  return 0;
}